

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmrc.hpp
# Opt level: O2

int __thiscall
cmrc::embedded_filesystem::open(embedded_filesystem *this,char *__file,int __oflag,...)

{
  file_or_directory *this_00;
  file_data *pfVar1;
  system_error *this_01;
  error_category *peVar2;
  error_code __ec;
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)__file);
  this_00 = _get(this,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  if ((this_00 != (file_or_directory *)0x0) && (this_00->_is_file != false)) {
    pfVar1 = detail::file_or_directory::as_file(this_00);
    return (int)pfVar1->begin_ptr;
  }
  this_01 = (system_error *)__cxa_allocate_exception(0x20);
  peVar2 = (error_category *)std::_V2::generic_category();
  __ec._M_cat = peVar2;
  __ec._0_8_ = 2;
  std::system_error::system_error(this_01,__ec,(string *)__file);
  __cxa_throw(this_01,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

file open(const std::string& path) const {
        auto entry_ptr = _get(path);
        if (!entry_ptr || !entry_ptr->is_file()) {
#ifdef CMRC_NO_EXCEPTIONS
            fprintf(stderr, "Error no such file or directory: %s\n", path.c_str());
            abort();
#else
            throw std::system_error(make_error_code(std::errc::no_such_file_or_directory), path);
#endif
        }
        auto& dat = entry_ptr->as_file();
        return file{dat.begin_ptr, dat.end_ptr};
    }